

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O0

int __thiscall loader::context_t::init(context_t *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  element_type *this_00;
  size_t sVar5;
  ulong uVar6;
  size_type sVar7;
  reference pbVar8;
  pointer pdVar9;
  undefined8 uVar10;
  void *pvVar11;
  ostream *this_01;
  byte local_8ca;
  allocator local_8b1;
  string local_8b0 [39];
  allocator local_889;
  string local_888 [39];
  allocator local_861;
  string local_860 [32];
  char *local_840;
  char *depr_msg;
  string local_818 [39];
  allocator local_7f1;
  string local_7f0 [32];
  string local_7d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0 [8];
  string errorMessage_3;
  undefined1 local_790 [8];
  zel_component_version_t compVersion_1;
  getVersion_t getVersion_1;
  allocator local_711;
  string local_710 [32];
  string local_6f0 [8];
  string tracingLayerLibraryPath;
  allocator local_6c9;
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [39];
  allocator local_661;
  string local_660 [32];
  string local_640 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620 [8];
  string errorMessage_2;
  undefined1 local_600 [8];
  zel_component_version_t compVersion;
  getVersion_t getVersion;
  string validationLayerLibraryPath;
  allocator local_581;
  string local_580 [32];
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *local_560;
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *local_558;
  __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
  local_550;
  __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
  local_548;
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *local_540;
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *local_538;
  __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
  local_530;
  __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
  local_528;
  undefined4 local_520;
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [32];
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [8];
  string message_2;
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428 [8];
  string errorMessage_1;
  undefined1 local_408 [23];
  allocator local_3f1;
  string local_3f0 [32];
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [32];
  string local_388 [32];
  long local_368;
  link_map *dlinfo_map;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340 [8];
  string message_1;
  void *handle_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f8;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [8];
  string errorMessage;
  undefined1 local_240 [23];
  allocator local_229;
  string local_228 [32];
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [8];
  string message;
  string local_1c0 [32];
  void *local_1a0;
  void *handle;
  string local_190 [32];
  string local_170 [39];
  allocator local_149;
  string local_148 [32];
  string local_128 [8];
  string loaderLibraryPathEnv;
  string local_108 [8];
  string loaderLibraryPath;
  int local_e4 [3];
  basic_string_view<char> local_d8;
  undefined1 local_c8 [64];
  shared_ptr<loader::Logger> local_88;
  string local_78 [8];
  string loadLibraryErrorValue;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  discoveredDrivers;
  context_t *this_local;
  
  if ((this->driverEnvironmentQueried & 1U) == 0) {
    discoveredDrivers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
    bVar2 = getenv_tobool("ZE_ENABLE_LOADER_DEBUG_TRACE");
    this->debugTraceEnabled = bVar2;
    discoverEnabledDrivers_abi_cxx11_();
    std::__cxx11::string::string(local_78);
    createLogger();
    std::shared_ptr<loader::Logger>::operator=(&this->zel_logger,&local_88);
    std::shared_ptr<loader::Logger>::~shared_ptr(&local_88);
    getenv_string_abi_cxx11_(local_c8 + 0x10);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_c8 + 0x10),"trace");
    local_8ca = 0;
    if (bVar2) {
      local_8ca = this->debugTraceEnabled ^ 0xff;
    }
    std::__cxx11::string::~string((string *)(local_c8 + 0x10));
    if ((local_8ca & 1) != 0) {
      this->debugTraceEnabled = true;
      peVar4 = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->zel_logger);
      peVar4->log_to_console = false;
    }
    peVar4 = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->zel_logger);
    if ((peVar4->logging_enabled & 1U) != 0) {
      std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &this->zel_logger);
      Logger::get_base_logger((Logger *)local_c8);
      this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_c8);
      sVar5 = std::char_traits<char>::length("Loader Version {}.{}.{} {}");
      local_d8.size_ = sVar5;
      local_e4[2] = 1;
      local_e4[1] = 0x16;
      local_e4[0] = 0;
      spdlog::logger::info<int,int,int,char_const(&)[41]>
                (this_00,(format_string_t<int,_int,_int,_const_char_(&)[41]>)local_d8,local_e4 + 2,
                 local_e4 + 1,local_e4,(char (*) [41])"c1872469737f807abc0ab8c4b35a263a568a6504");
      std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)local_c8);
    }
    add_loader_version(this);
    std::__cxx11::string::string(local_108);
    getenv_string_abi_cxx11_((char *)local_128);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=(local_108,local_128);
    }
    if ((this->debugTraceEnabled & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"Using Loader Library Path: ",&local_149);
      std::__cxx11::string::string(local_170,local_108);
      debug_trace_message(this,(string *)local_148,(string *)local_170);
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
    }
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_58);
    bVar2 = getenv_tobool("ZE_ENABLE_NULL_DRIVER");
    std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::reserve
              (&this->zeDrivers,sVar7 + bVar2);
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_58);
    bVar2 = getenv_tobool("ZE_ENABLE_NULL_DRIVER");
    std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::reserve
              (&this->zesDrivers,sVar7 + bVar2);
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_58);
    bVar2 = getenv_tobool("ZE_ENABLE_NULL_DRIVER");
    std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::reserve
              (&this->allDrivers,sVar7 + bVar2);
    bVar2 = getenv_tobool("ZE_ENABLE_NULL_DRIVER");
    if (bVar2) {
      peVar4 = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->zel_logger);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_190,"Enabling Null Driver",(allocator *)((long)&handle + 7));
      Logger::log_info(peVar4,(string *)local_190);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)((long)&handle + 7));
      std::__cxx11::string::c_str();
      create_library_path_abi_cxx11_((char *)local_1c0,"libze_null.so.1");
      uVar10 = std::__cxx11::string::c_str();
      pvVar11 = (void *)dlopen(uVar10,1);
      std::__cxx11::string::~string(local_1c0);
      local_1a0 = pvVar11;
      if ((this->debugTraceEnabled & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1e0,"ze_null Driver Init",&local_1e1);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
        std::__cxx11::string::string(local_208,local_1e0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_228,"",&local_229);
        debug_trace_message(this,(string *)local_208,(string *)local_228);
        std::__cxx11::string::~string(local_228);
        std::allocator<char>::~allocator((allocator<char> *)&local_229);
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string(local_1e0);
      }
      if (local_1a0 == (void *)0x0) {
        if ((this->debugTraceEnabled & 1U) != 0) {
          dlerror();
          std::__cxx11::string::assign((char *)local_78);
          std::__cxx11::string::c_str();
          create_library_path_abi_cxx11_((char *)local_2a0,"libze_null.so.1");
          std::operator+((char *)local_280,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Load Library of ");
          std::operator+(local_260,(char *)local_280);
          std::__cxx11::string::~string(local_280);
          std::__cxx11::string::~string(local_2a0);
          std::__cxx11::string::string(local_2c0,(string *)local_260);
          std::__cxx11::string::string((string *)&__range1,local_78);
          debug_trace_message(this,(string *)local_2c0,(string *)&__range1);
          std::__cxx11::string::~string((string *)&__range1);
          std::__cxx11::string::~string(local_2c0);
          std::__cxx11::string::clear();
          std::__cxx11::string::~string((string *)local_260);
        }
      }
      else {
        std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::emplace_back<>
                  (&this->allDrivers);
        pvVar11 = local_1a0;
        std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::rbegin
                  ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)(local_240 + 8));
        pdVar9 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>_>
                               *)(local_240 + 8));
        pdVar9->handle = pvVar11;
        std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::rbegin
                  ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)local_240);
        pdVar9 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>_>
                               *)local_240);
        std::__cxx11::string::operator=((string *)&pdVar9->name,"ze_null");
      }
    }
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_58);
    local_2f8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_58);
    while (bVar2 = __gnu_cxx::operator!=(&__end1,&local_2f8), bVar2) {
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      std::__cxx11::string::string((string *)&handle_1,(string *)pbVar8);
      uVar10 = std::__cxx11::string::c_str();
      pvVar11 = (void *)dlopen(uVar10,1);
      if (pvVar11 == (void *)0x0) {
        if ((this->debugTraceEnabled & 1U) != 0) {
          dlerror();
          std::__cxx11::string::assign((char *)local_78);
          std::operator+((char *)local_448,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Load Library of ");
          std::operator+(local_428,(char *)local_448);
          std::__cxx11::string::~string(local_448);
          std::__cxx11::string::string(local_468,(string *)local_428);
          std::__cxx11::string::string(local_488,local_78);
          debug_trace_message(this,(string *)local_468,(string *)local_488);
          std::__cxx11::string::~string(local_488);
          std::__cxx11::string::~string(local_468);
          std::__cxx11::string::clear();
          std::__cxx11::string::~string((string *)local_428);
        }
      }
      else {
        if ((this->debugTraceEnabled & 1U) != 0) {
          std::operator+((char *)&dlinfo_map,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Loading Driver ");
          std::operator+(local_340,(char *)&dlinfo_map);
          std::__cxx11::string::~string((string *)&dlinfo_map);
          iVar3 = dlinfo(pvVar11,2,&local_368);
          if (iVar3 == 0) {
            pcVar1 = *(char **)(local_368 + 8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_3a8,pcVar1,&local_3a9);
            std::operator+((char *)local_388,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           " from: ");
            std::__cxx11::string::operator+=((string *)local_340,local_388);
            std::__cxx11::string::~string(local_388);
            std::__cxx11::string::~string(local_3a8);
            std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
          }
          std::__cxx11::string::string(local_3d0,(string *)local_340);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3f0,"",&local_3f1);
          debug_trace_message(this,(string *)local_3d0,(string *)local_3f0);
          std::__cxx11::string::~string(local_3f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
          std::__cxx11::string::~string(local_3d0);
          std::__cxx11::string::~string((string *)local_340);
        }
        std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::emplace_back<>
                  (&this->allDrivers);
        std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::rbegin
                  ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)(local_408 + 8));
        pdVar9 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>_>
                               *)(local_408 + 8));
        pdVar9->handle = pvVar11;
        std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::rbegin
                  ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)local_408);
        pdVar9 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>_>
                               *)local_408);
        std::__cxx11::string::operator=((string *)&pdVar9->name,(string *)&handle_1);
      }
      std::__cxx11::string::~string((string *)&handle_1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    sVar7 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                      (&this->allDrivers);
    if (sVar7 == 0) {
      if ((this->debugTraceEnabled & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4a8,"0 Drivers Discovered",&local_4a9);
        std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
        std::__cxx11::string::string(local_4d0,local_4a8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4f0,"",&local_4f1);
        debug_trace_message(this,(string *)local_4d0,(string *)local_4f0);
        std::__cxx11::string::~string(local_4f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
        std::__cxx11::string::~string(local_4d0);
        std::__cxx11::string::~string(local_4a8);
      }
      peVar4 = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->zel_logger);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_518,"0 Drivers Discovered",&local_519);
      Logger::log_error(peVar4,(string *)local_518);
      std::__cxx11::string::~string(local_518);
      std::allocator<char>::~allocator((allocator<char> *)&local_519);
      this_local._4_4_ = 0x78000001;
      local_520 = 1;
    }
    else {
      local_528._M_current =
           (driver_t *)
           std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin
                     (&this->allDrivers);
      local_530._M_current =
           (driver_t *)
           std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(&this->allDrivers);
      local_538 = (vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                  std::back_inserter<std::vector<loader::driver_t,std::allocator<loader::driver_t>>>
                            (&this->zeDrivers);
      local_540 = (vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                  std::
                  copy<__gnu_cxx::__normal_iterator<loader::driver_t*,std::vector<loader::driver_t,std::allocator<loader::driver_t>>>,std::back_insert_iterator<std::vector<loader::driver_t,std::allocator<loader::driver_t>>>>
                            (local_528,local_530,
                             (back_insert_iterator<std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                              )local_538);
      local_548._M_current =
           (driver_t *)
           std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin
                     (&this->allDrivers);
      local_550._M_current =
           (driver_t *)
           std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(&this->allDrivers);
      local_558 = (vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                  std::back_inserter<std::vector<loader::driver_t,std::allocator<loader::driver_t>>>
                            (&this->zesDrivers);
      local_560 = (vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                  std::
                  copy<__gnu_cxx::__normal_iterator<loader::driver_t*,std::vector<loader::driver_t,std::allocator<loader::driver_t>>>,std::back_insert_iterator<std::vector<loader::driver_t,std::allocator<loader::driver_t>>>>
                            (local_548,local_550,
                             (back_insert_iterator<std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                              )local_558);
      bVar2 = getenv_tobool("ZE_ENABLE_VALIDATION_LAYER");
      if (bVar2) {
        peVar4 = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->zel_logger);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_580,"Validation Layer Enabled",&local_581);
        Logger::log_info(peVar4,(string *)local_580);
        std::__cxx11::string::~string(local_580);
        std::allocator<char>::~allocator((allocator<char> *)&local_581);
        std::__cxx11::string::c_str();
        create_library_path_abi_cxx11_((char *)&getVersion,"libze_validation_layer.so.1");
        uVar10 = std::__cxx11::string::c_str();
        pvVar11 = (void *)dlopen(uVar10,1);
        this->validationLayer = pvVar11;
        if (this->validationLayer == (void *)0x0) {
          if ((this->debugTraceEnabled & 1U) != 0) {
            dlerror();
            std::__cxx11::string::assign((char *)local_78);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_660,"libze_validation_layer.so.1",&local_661);
            std::operator+((char *)local_640,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Load Library of ");
            std::operator+(local_620,(char *)local_640);
            std::__cxx11::string::~string(local_640);
            std::__cxx11::string::~string(local_660);
            std::allocator<char>::~allocator((allocator<char> *)&local_661);
            std::__cxx11::string::string(local_688,(string *)local_620);
            std::__cxx11::string::string(local_6a8,local_78);
            debug_trace_message(this,(string *)local_688,(string *)local_6a8);
            std::__cxx11::string::~string(local_6a8);
            std::__cxx11::string::~string(local_688);
            std::__cxx11::string::clear();
            std::__cxx11::string::~string((string *)local_620);
          }
        }
        else {
          compVersion.component_lib_version._4_8_ =
               dlsym(this->validationLayer,"zelLoaderGetVersion");
          if (((code *)compVersion.component_lib_version._4_8_ != (code *)0x0) &&
             (iVar3 = (*(code *)compVersion.component_lib_version._4_8_)(local_600), iVar3 == 0)) {
            std::vector<zel_component_version,_std::allocator<zel_component_version>_>::push_back
                      (&this->compVersions,(value_type *)local_600);
          }
        }
        std::__cxx11::string::~string((string *)&getVersion);
      }
      bVar2 = getenv_tobool("ZE_ENABLE_TRACING_LAYER");
      if (bVar2) {
        peVar4 = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->zel_logger);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_6c8,"Tracing Layer Enabled",&local_6c9);
        Logger::log_info(peVar4,(string *)local_6c8);
        std::__cxx11::string::~string(local_6c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
        this->tracingLayerEnabled = true;
      }
      std::__cxx11::string::c_str();
      create_library_path_abi_cxx11_((char *)local_6f0,"libze_tracing_layer.so.1");
      if ((this->debugTraceEnabled & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_710,"Tracing Layer Library Path: ",&local_711);
        std::__cxx11::string::string((string *)&getVersion_1,local_6f0);
        debug_trace_message(this,(string *)local_710,(string *)&getVersion_1);
        std::__cxx11::string::~string((string *)&getVersion_1);
        std::__cxx11::string::~string(local_710);
        std::allocator<char>::~allocator((allocator<char> *)&local_711);
      }
      uVar10 = std::__cxx11::string::c_str();
      pvVar11 = (void *)dlopen(uVar10,1);
      this->tracingLayer = pvVar11;
      if (this->tracingLayer == (void *)0x0) {
        if ((this->debugTraceEnabled & 1U) != 0) {
          dlerror();
          std::__cxx11::string::assign((char *)local_78);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_7f0,"libze_tracing_layer.so.1",&local_7f1);
          std::operator+((char *)local_7d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Load Library of ");
          std::operator+(local_7b0,(char *)local_7d0);
          std::__cxx11::string::~string(local_7d0);
          std::__cxx11::string::~string(local_7f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
          std::__cxx11::string::string(local_818,(string *)local_7b0);
          std::__cxx11::string::string((string *)&depr_msg,local_78);
          debug_trace_message(this,(string *)local_818,(string *)&depr_msg);
          std::__cxx11::string::~string((string *)&depr_msg);
          std::__cxx11::string::~string(local_818);
          std::__cxx11::string::clear();
          std::__cxx11::string::~string((string *)local_7b0);
        }
      }
      else {
        compVersion_1.component_lib_version._4_8_ = dlsym(this->tracingLayer,"zelLoaderGetVersion");
        if (((code *)compVersion_1.component_lib_version._4_8_ != (code *)0x0) &&
           (iVar3 = (*(code *)compVersion_1.component_lib_version._4_8_)(local_790), iVar3 == 0)) {
          std::vector<zel_component_version,_std::allocator<zel_component_version>_>::push_back
                    (&this->compVersions,(value_type *)local_790);
        }
      }
      bVar2 = getenv_tobool("ZET_ENABLE_API_TRACING_EXP");
      if (bVar2) {
        local_840 = "ZET_ENABLE_API_TRACING_EXP is deprecated. Use ZE_ENABLE_TRACING_LAYER instead";
        peVar4 = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->zel_logger);
        pcVar1 = local_840;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_860,pcVar1,&local_861);
        Logger::log_warning(peVar4,(string *)local_860);
        std::__cxx11::string::~string(local_860);
        std::allocator<char>::~allocator((allocator<char> *)&local_861);
        this_01 = std::operator<<((ostream *)&std::cout,local_840);
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      }
      bVar2 = getenv_tobool("ZE_ENABLE_LOADER_INTERCEPT");
      this->forceIntercept = bVar2;
      this->sysmanInstanceDrivers = &this->zeDrivers;
      if (((this->forceIntercept & 1U) != 0) ||
         (sVar7 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                            (&this->allDrivers), 1 < sVar7)) {
        this->intercept_enabled = true;
        peVar4 = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->zel_logger);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_888,"Intercept Enabled",&local_889);
        Logger::log_info(peVar4,(string *)local_888);
        std::__cxx11::string::~string(local_888);
        std::allocator<char>::~allocator((allocator<char> *)&local_889);
      }
      this->driverEnvironmentQueried = true;
      peVar4 = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->zel_logger);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8b0,"zeInit succeeded",&local_8b1);
      Logger::log_info(peVar4,(string *)local_8b0);
      std::__cxx11::string::~string(local_8b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
      this_local._4_4_ = 0;
      local_520 = 1;
      std::__cxx11::string::~string(local_6f0);
    }
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t context_t::init()
    {
        if (driverEnvironmentQueried) {
            return ZE_RESULT_SUCCESS;
        }
        debugTraceEnabled = getenv_tobool( "ZE_ENABLE_LOADER_DEBUG_TRACE" );
        auto discoveredDrivers = discoverEnabledDrivers();
        std::string loadLibraryErrorValue;

        zel_logger = createLogger();

        if ((getenv_string("ZEL_LOADER_LOGGING_LEVEL") == "trace") && !debugTraceEnabled) {
            debugTraceEnabled = true;
            zel_logger->log_to_console = false;
        }

        if (zel_logger->logging_enabled)
            zel_logger->get_base_logger()->info("Loader Version {}.{}.{} {}", LOADER_VERSION_MAJOR, LOADER_VERSION_MINOR, LOADER_VERSION_PATCH, LOADER_VERSION_SHA);

        add_loader_version();
        std::string loaderLibraryPath;
        auto loaderLibraryPathEnv = getenv_string("ZEL_LIBRARY_PATH");
        if (!loaderLibraryPathEnv.empty()) {
            loaderLibraryPath = loaderLibraryPathEnv;
        }
#ifdef _WIN32
        else {
            loaderLibraryPath = readLevelZeroLoaderLibraryPath();
        }
#endif
        if (debugTraceEnabled)
            debug_trace_message("Using Loader Library Path: ", loaderLibraryPath);

        // To allow for two different sets of drivers to be in use between sysman and core/tools, we use and store the drivers in two vectors.
        // alldrivers stores all the drivers for cleanup when the library exits.
        zeDrivers.reserve( discoveredDrivers.size() + getenv_tobool( "ZE_ENABLE_NULL_DRIVER" ) );
        zesDrivers.reserve( discoveredDrivers.size() + getenv_tobool( "ZE_ENABLE_NULL_DRIVER" ) );
        allDrivers.reserve( discoveredDrivers.size() + getenv_tobool( "ZE_ENABLE_NULL_DRIVER" ) );
        if( getenv_tobool( "ZE_ENABLE_NULL_DRIVER" ) )
        {
            zel_logger->log_info("Enabling Null Driver");
            auto handle = LOAD_DRIVER_LIBRARY( create_library_path( MAKE_LIBRARY_NAME( "ze_null", L0_LOADER_VERSION ), loaderLibraryPath.c_str()).c_str());
            if (debugTraceEnabled) {
                std::string message = "ze_null Driver Init";
                debug_trace_message(message, "");
            }
            if( NULL != handle )
            {
                allDrivers.emplace_back();
                allDrivers.rbegin()->handle = handle;
                allDrivers.rbegin()->name = "ze_null";
            } else if (debugTraceEnabled) {
                GET_LIBRARY_ERROR(loadLibraryErrorValue);
                std::string errorMessage = "Load Library of " + create_library_path( MAKE_LIBRARY_NAME( "ze_null", L0_LOADER_VERSION ), loaderLibraryPath.c_str()) + " failed with ";
                debug_trace_message(errorMessage, loadLibraryErrorValue);
                loadLibraryErrorValue.clear();
            }
        }

        for( auto name : discoveredDrivers )
        {
            auto handle = LOAD_DRIVER_LIBRARY( name.c_str() );
            if( NULL != handle )
            {
                if (debugTraceEnabled) {
                    std::string message = "Loading Driver " + name + " succeeded";
#if !defined(_WIN32) && !defined(ANDROID)
                    // TODO: implement same message for windows, move dlinfo to ze_util.h as a macro
                    struct link_map *dlinfo_map;
                    if (dlinfo(handle, RTLD_DI_LINKMAP, &dlinfo_map) == 0) {
                        message += " from: " + std::string(dlinfo_map->l_name);
                    }
#endif
                    debug_trace_message(message, "");
                }
                allDrivers.emplace_back();
                allDrivers.rbegin()->handle = handle;
                allDrivers.rbegin()->name = name;
            } else if (debugTraceEnabled) {
                GET_LIBRARY_ERROR(loadLibraryErrorValue);
                std::string errorMessage = "Load Library of " + name + " failed with ";
                debug_trace_message(errorMessage, loadLibraryErrorValue);
                loadLibraryErrorValue.clear();
            }
        }
        if(allDrivers.size()==0){
            if (debugTraceEnabled) {
                std::string message = "0 Drivers Discovered";
                debug_trace_message(message, "");
            }
            zel_logger->log_error("0 Drivers Discovered");
            return ZE_RESULT_ERROR_UNINITIALIZED;
        }
        std::copy(allDrivers.begin(), allDrivers.end(), std::back_inserter(zeDrivers));
        std::copy(allDrivers.begin(), allDrivers.end(), std::back_inserter(zesDrivers));

        typedef ze_result_t (ZE_APICALL *getVersion_t)(zel_component_version_t *version);
        if( getenv_tobool( "ZE_ENABLE_VALIDATION_LAYER" ) )
        {
            zel_logger->log_info("Validation Layer Enabled");
            std::string validationLayerLibraryPath = create_library_path(MAKE_LAYER_NAME( "ze_validation_layer" ), loaderLibraryPath.c_str());
            validationLayer = LOAD_DRIVER_LIBRARY( validationLayerLibraryPath.c_str() );
            if(validationLayer)
            {
                auto getVersion = reinterpret_cast<getVersion_t>(
                    GET_FUNCTION_PTR(validationLayer, "zelLoaderGetVersion"));
                zel_component_version_t compVersion;
                if(getVersion && ZE_RESULT_SUCCESS == getVersion(&compVersion))
                {   
                    compVersions.push_back(compVersion);
                }
            } else if (debugTraceEnabled) {
                GET_LIBRARY_ERROR(loadLibraryErrorValue);
                std::string errorMessage = "Load Library of " + std::string(MAKE_LAYER_NAME( "ze_validation_layer" )) + " failed with ";
                debug_trace_message(errorMessage, loadLibraryErrorValue);
                loadLibraryErrorValue.clear();
            }
        }

        if (getenv_tobool( "ZE_ENABLE_TRACING_LAYER" )) {
            zel_logger->log_info("Tracing Layer Enabled");
            tracingLayerEnabled = true;
        }
        std::string tracingLayerLibraryPath = create_library_path(MAKE_LAYER_NAME( "ze_tracing_layer" ), loaderLibraryPath.c_str());
        if (debugTraceEnabled)
            debug_trace_message("Tracing Layer Library Path: ", tracingLayerLibraryPath);
        tracingLayer = LOAD_DRIVER_LIBRARY( tracingLayerLibraryPath.c_str() );
        if(tracingLayer)
        {
            auto getVersion = reinterpret_cast<getVersion_t>(
                GET_FUNCTION_PTR(tracingLayer, "zelLoaderGetVersion"));
            zel_component_version_t compVersion;
            if(getVersion && ZE_RESULT_SUCCESS == getVersion(&compVersion))
            {   
                compVersions.push_back(compVersion);
            }
        } else if (debugTraceEnabled) {
            GET_LIBRARY_ERROR(loadLibraryErrorValue);
            std::string errorMessage = "Load Library of " + std::string(MAKE_LAYER_NAME( "ze_tracing_layer" )) + " failed with ";
            debug_trace_message(errorMessage, loadLibraryErrorValue);
            loadLibraryErrorValue.clear();
        }

        if( getenv_tobool( "ZET_ENABLE_API_TRACING_EXP" ) ) {
            auto depr_msg = "ZET_ENABLE_API_TRACING_EXP is deprecated. Use ZE_ENABLE_TRACING_LAYER instead";
            zel_logger->log_warning(depr_msg);
            std::cout << depr_msg << std::endl;
        }

        forceIntercept = getenv_tobool( "ZE_ENABLE_LOADER_INTERCEPT" );

        // Default sysmanInstance Drivers to be the zeDrivers list unless zesInit is called during init.
        sysmanInstanceDrivers = &zeDrivers;

        if(forceIntercept || allDrivers.size() > 1){
             intercept_enabled = true;
             zel_logger->log_info("Intercept Enabled");
        }

        driverEnvironmentQueried = true;

        zel_logger->log_info("zeInit succeeded");
        return ZE_RESULT_SUCCESS;
    }